

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

unsigned_long_long
el::base::utils::DateTime::getTimeDifference
          (timeval *endTime,timeval *startTime,TimestampUnit timestampUnit)

{
  unsigned_long_long uVar1;
  int in_EDX;
  timeval *in_RSI;
  timeval *in_RDI;
  anon_class_1_0_00000001 conv;
  anon_class_1_0_00000001 local_1d [5];
  timeval *local_18;
  unsigned_long_long local_8;
  
  if (in_EDX == 0) {
    local_8 = (in_RDI->tv_sec * 1000000 + in_RDI->tv_usec) -
              (in_RSI->tv_sec * 1000000 + in_RSI->tv_usec);
  }
  else {
    local_18 = in_RSI;
    uVar1 = getTimeDifference::anon_class_1_0_00000001::operator()(local_1d,in_RDI);
    local_8 = getTimeDifference::anon_class_1_0_00000001::operator()(local_1d,local_18);
    local_8 = uVar1 - local_8;
  }
  return local_8;
}

Assistant:

unsigned long long DateTime::getTimeDifference(const struct timeval& endTime, const struct timeval& startTime,
    base::TimestampUnit timestampUnit) {
  if (timestampUnit == base::TimestampUnit::Microsecond) {
    return static_cast<unsigned long long>(static_cast<unsigned long long>(1000000 * endTime.tv_sec + endTime.tv_usec) -
                                           static_cast<unsigned long long>(1000000 * startTime.tv_sec + startTime.tv_usec));
  }
  // milliseconds
  auto conv = [](const struct timeval& tim) {
    return static_cast<unsigned long long>((tim.tv_sec * 1000) + (tim.tv_usec / 1000));
  };
  return static_cast<unsigned long long>(conv(endTime) - conv(startTime));
}